

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

ResetPtr __thiscall libcellml::AnyCellmlElement::reset(AnyCellmlElement *this)

{
  AnyCellmlElementImpl *pAVar1;
  undefined8 *puVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 *in_RSI;
  ResetPtr RVar3;
  
  if (*(int *)*in_RSI - 8U < 3) {
    puVar2 = (undefined8 *)
             std::__any_caster<std::shared_ptr<libcellml::Reset>>((any *)((int *)*in_RSI + 2));
    if (puVar2 == (undefined8 *)0x0) {
      std::__throw_bad_any_cast();
    }
    this->mPimpl = (AnyCellmlElementImpl *)*puVar2;
    pAVar1 = (AnyCellmlElementImpl *)puVar2[1];
    this[1].mPimpl = pAVar1;
    in_RDX._M_pi = extraout_RDX;
    if (pAVar1 != (AnyCellmlElementImpl *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(pAVar1->mItem)._M_manager = *(int *)&(pAVar1->mItem)._M_manager + 1;
        UNLOCK();
      }
      else {
        *(int *)&(pAVar1->mItem)._M_manager = *(int *)&(pAVar1->mItem)._M_manager + 1;
      }
    }
  }
  else {
    this->mPimpl = (AnyCellmlElementImpl *)0x0;
    this[1].mPimpl = (AnyCellmlElementImpl *)0x0;
  }
  RVar3.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  RVar3.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ResetPtr)RVar3.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ResetPtr AnyCellmlElement::reset() const
{
    if ((mPimpl->mType == CellmlElementType::RESET)
        || (mPimpl->mType == CellmlElementType::RESET_VALUE)
        || (mPimpl->mType == CellmlElementType::TEST_VALUE)) {
        try {
            return std::any_cast<ResetPtr>(mPimpl->mItem);
        } catch (const std::bad_any_cast &) {
            return nullptr;
        }
    }

    return nullptr;
}